

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  ImGuiTabBar *__src;
  ImGuiTabBar *__dest;
  int iVar2;
  int iVar3;
  
  iVar1 = this->FreeIdx;
  if (iVar1 == (this->Buf).Size) {
    iVar2 = iVar1 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar1 < iVar3) {
      __dest = (this->Buf).Data;
      iVar3 = iVar2;
    }
    else {
      if (iVar3 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar3 / 2 + iVar3;
      }
      if (iVar3 <= iVar2) {
        iVar3 = iVar2;
      }
      __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar3 * 0xa0);
      __src = (this->Buf).Data;
      if (__src != (ImGuiTabBar *)0x0) {
        memcpy(__dest,__src,(long)(this->Buf).Size * 0xa0);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar3;
      iVar3 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar2;
  }
  else {
    __dest = (this->Buf).Data;
    iVar3 = __dest[iVar1].Tabs.Size;
  }
  this->FreeIdx = iVar3;
  memset(__dest + iVar1,0,0xa0);
  __dest[iVar1].CurrFrameVisible = -1;
  __dest[iVar1].PrevFrameVisible = -1;
  __dest[iVar1].LastTabItemIdx = -1;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }